

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_ObjPrintNeighborhood_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int depth)

{
  long lVar1;
  
  if (-1 < depth && (char)((*(uint *)&pObj->field_0x14 & 0x40) >> 6) == '\0') {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
    Vec_PtrPush(vNodes,pObj);
    Abc_ObjPrint(_stdout,pObj);
    for (lVar1 = 0; lVar1 < (pObj->vFanouts).nSize; lVar1 = lVar1 + 1) {
      Abc_ObjPrintNeighborhood_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]],vNodes,
                 depth + -1);
    }
    for (lVar1 = 0; lVar1 < (pObj->vFanins).nSize; lVar1 = lVar1 + 1) {
      Abc_ObjPrintNeighborhood_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar1]],vNodes,
                 depth + -1);
    }
  }
  return;
}

Assistant:

static void Abc_ObjPrintNeighborhood_rec( Abc_Obj_t *pObj, Vec_Ptr_t *vNodes, int depth ) {
  Abc_Obj_t *pObj2;
  int i;
  
  if (pObj->fMarkC || depth < 0) return;

  pObj->fMarkC = 1;
  Vec_PtrPush( vNodes, pObj );

  Abc_ObjPrint( stdout, pObj );

  Abc_ObjForEachFanout(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
  Abc_ObjForEachFanin(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
}